

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::SSATransformFixVisitor::visit(SSATransformFixVisitor *this,Generator *gen)

{
  pointer *this_00;
  element_type *this_01;
  bool bVar1;
  undefined1 auVar2 [8];
  undefined1 local_70 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  shared_ptr<kratos::StmtBlock> blk_stmt;
  allocator<char> local_31;
  
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         local_70,&gen->stmts_);
  this_00 = &stmts.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (auVar2 = local_70;
      auVar2 != (undefined1  [8])
                stmts.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar2 = (undefined1  [8])((long)auVar2 + 0x10)) {
    this_01 = (((pointer)auVar2)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if (this_01->type_ == Block) {
      std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"ssa",&local_31);
      bVar1 = IRNode::has_attribute(&this_01->super_IRNode,(string *)this_00);
      std::__cxx11::string::~string((string *)this_00);
      if (bVar1) {
        Stmt::as<kratos::StmtBlock>((Stmt *)this_00);
        if (*(int *)&stmts.
                     super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0xd].
                     super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            == 0) {
          process_always_comb((shared_ptr<kratos::StmtBlock> *)this_00);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&blk_stmt);
      }
    }
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          local_70);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmts = gen->get_all_stmts();
        for (auto const &stmt : stmts) {
            if (stmt->type() == StatementType::Block && stmt->has_attribute("ssa")) {
                auto blk_stmt = stmt->as<StmtBlock>();
                if (blk_stmt->block_type() == StatementBlockType::Combinational) {
                    process_always_comb(blk_stmt);
                }
            }
        }
    }